

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O2

int formt_(integer *m,doublereal *wt,doublereal *sy,doublereal *ss,integer *col,doublereal *theta,
          integer *info)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  doublereal *pdVar5;
  doublereal *pdVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  doublereal *pdVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  
  iVar1 = *m;
  uVar4 = (ulong)iVar1;
  uVar12 = ~uVar4;
  uVar2 = *col;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  lVar7 = uVar12 * 8 + uVar4 * 8 + 8;
  while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
    *(double *)((long)wt + lVar7) = *theta * *(double *)((long)ss + lVar7);
    lVar7 = lVar7 + uVar4 * 8;
  }
  pdVar6 = sy + uVar12 + uVar4 + 2;
  for (uVar9 = 2; pdVar11 = pdVar6, uVar13 = uVar9, (long)uVar9 <= (long)(int)uVar2;
      uVar9 = uVar9 + 1) {
    for (; (long)uVar13 <= (long)(int)uVar2; uVar13 = uVar13 + 1) {
      uVar3 = uVar13;
      if ((int)uVar9 < (int)uVar13) {
        uVar3 = uVar9;
      }
      dVar15 = 0.0;
      lVar7 = 0;
      iVar8 = iVar1;
      pdVar5 = sy + uVar12;
      for (uVar10 = 1; pdVar5 = pdVar5 + 1, uVar10 < (uVar3 & 0xffffffff); uVar10 = uVar10 + 1) {
        dVar15 = dVar15 + (pdVar6[lVar7] * pdVar11[lVar7]) / pdVar5[iVar8];
        iVar8 = iVar8 + iVar1;
        lVar7 = lVar7 + uVar4;
      }
      lVar7 = uVar13 * uVar4 + uVar9;
      wt[uVar12 + lVar7] = *theta * ss[uVar12 + lVar7] + dVar15;
      pdVar11 = pdVar11 + 1;
    }
    pdVar6 = pdVar6 + 1;
  }
  dpofa_(wt,m,col,info);
  if (*info != 0) {
    *info = -3;
  }
  return 0;
}

Assistant:

int formt_(integer *m, doublereal *wt, doublereal *sy, 
	doublereal *ss, integer *col, doublereal *theta, integer *info)
{
    /* System generated locals */
    integer wt_dim1, wt_offset, sy_dim1, sy_offset, ss_dim1, ss_offset, i__1, 
	    i__2, i__3;

    /* Local variables */
    static integer i__, j, k, k1;
    static doublereal ddum;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *);

/*     ************ */

/*     Subroutine formt */

/*       This subroutine forms the upper half of the pos. def. and symm. */
/*         T = theta*SS + L*D^(-1)*L', stores T in the upper triangle */
/*         of the array wt, and performs the Cholesky factorization of T */
/*         to produce J*J', with J' stored in the upper triangle of wt. */

/*     Subprograms called: */

/*       Linpack ... dpofa. */


/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the upper half of  T = theta*SS + L*D^(-1)*L', */
/*        store T in the upper triangle of the array wt. */
    /* Parameter adjustments */
    ss_dim1 = *m;
    ss_offset = 1 + ss_dim1;
    ss -= ss_offset;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wt_dim1 = *m;
    wt_offset = 1 + wt_dim1;
    wt -= wt_offset;

    /* Function Body */
    i__1 = *col;
    for (j = 1; j <= i__1; ++j) {
	wt[j * wt_dim1 + 1] = *theta * ss[j * ss_dim1 + 1];
/* L52: */
    }
    i__1 = *col;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *col;
	for (j = i__; j <= i__2; ++j) {
	    k1 = min(i__,j) - 1;
	    ddum = 0.;
	    i__3 = k1;
	    for (k = 1; k <= i__3; ++k) {
		ddum += sy[i__ + k * sy_dim1] * sy[j + k * sy_dim1] / sy[k + 
			k * sy_dim1];
/* L53: */
	    }
	    wt[i__ + j * wt_dim1] = ddum + *theta * ss[i__ + j * ss_dim1];
/* L54: */
	}
/* L55: */
    }
/*     Cholesky factorize T to J*J' with */
/*        J' stored in the upper triangle of wt. */
    dpofa_(&wt[wt_offset], m, col, info);
    if (*info != 0) {
	*info = -3;
    }
    return 0;
}